

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * fmt::v10::detail::do_parse_arg_id<char,fmt::v10::detail::dynamic_spec_id_handler<char>&>
                 (char *begin,char *end,dynamic_spec_id_handler<char> *handler)

{
  byte bVar1;
  arg_ref<char> *paVar2;
  int id;
  byte *pbVar3;
  byte *pbVar4;
  type tVar5;
  byte *pbVar6;
  byte *local_20;
  
  bVar1 = *begin;
  local_20 = (byte *)begin;
  if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_20 = (byte *)(begin + 1);
      id = 0;
    }
    else {
      id = parse_nonnegative_int<char>((char **)&local_20,end,0x7fffffff);
    }
    if ((local_20 == (byte *)end) || ((*local_20 != 0x3a && (*local_20 != 0x7d)))) {
LAB_0011b4ea:
      throw_format_error("invalid format string");
    }
    dynamic_spec_id_handler<char>::on_index(handler,id);
    pbVar6 = local_20;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_0011b4ea;
    pbVar4 = (byte *)(begin + 1);
    do {
      pbVar3 = pbVar4;
      pbVar6 = (byte *)end;
      if (pbVar3 == (byte *)end) break;
      bVar1 = *pbVar3;
      pbVar4 = pbVar3 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar6 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    tVar5 = to_unsigned<long>((long)pbVar6 - (long)begin);
    paVar2 = handler->ref;
    paVar2->kind = name;
    (paVar2->val).name.data_ = begin;
    (paVar2->val).name.size_ = tVar5;
  }
  return (char *)pbVar6;
}

Assistant:

FMT_CONSTEXPR auto do_parse_arg_id(const Char* begin, const Char* end,
                                   Handler&& handler) -> const Char* {
  Char c = *begin;
  if (c >= '0' && c <= '9') {
    int index = 0;
    constexpr int max = (std::numeric_limits<int>::max)();
    if (c != '0')
      index = parse_nonnegative_int(begin, end, max);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      throw_format_error("invalid format string");
    else
      handler.on_index(index);
    return begin;
  }
  if (!is_name_start(c)) {
    throw_format_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(*it) || ('0' <= *it && *it <= '9')));
  handler.on_name({begin, to_unsigned(it - begin)});
  return it;
}